

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNKalm.cpp
# Opt level: O2

void __thiscall NaPNKalman::relate_connectors(NaPNKalman *this)

{
  uint uVar1;
  NaVector *pNVar2;
  undefined8 extraout_RDX;
  
  uVar1 = NaMatrix::dim_rows(&this->A);
  this->n = uVar1;
  uVar1 = NaMatrix::dim_cols(&this->B);
  this->k = uVar1;
  uVar1 = NaMatrix::dim_rows(&this->C);
  this->m = uVar1;
  pNVar2 = NaPetriCnOutput::data(&this->y_obs);
  (*pNVar2->_vptr_NaVector[4])(pNVar2,(ulong)this->m);
  pNVar2 = NaPetriCnOutput::data(&this->x_int);
  (*pNVar2->_vptr_NaVector[4])(pNVar2,(ulong)this->n);
  pNVar2 = NaPetriCnOutput::data(&this->x_est);
  (*pNVar2->_vptr_NaVector[4])(pNVar2,(ulong)this->n,extraout_RDX,pNVar2->_vptr_NaVector[4]);
  return;
}

Assistant:

void
NaPNKalman::relate_connectors ()
{
    // initialize dimensions
    n = A.dim_rows();
    k = B.dim_cols();
    m = C.dim_rows();

    // Assign output dimensions
    y_obs.data().new_dim(m);
    x_int.data().new_dim(n);
    x_est.data().new_dim(n);
}